

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O1

void * RazorAHRSThread(void *pParam)

{
  int iVar1;
  long lVar2;
  long lVar3;
  RAZORAHRSDATA *pRVar4;
  RAZORAHRSDATA *pRVar5;
  int iVar6;
  CRITICAL_SECTION *__mutex;
  RAZORAHRSDATA *pRVar7;
  byte bVar8;
  RAZORAHRSDATA razorahrsdata;
  timespec local_a8;
  RAZORAHRSDATA local_98;
  
  bVar8 = 0;
  __mutex = RazorAHRSCS;
  pRVar7 = razorahrsdataRazorAHRS;
  lVar3 = 0;
  do {
    if (*(void **)((long)addrsRazorAHRS + lVar3 * 2) == pParam) {
      local_98.Pitch = 0.0;
      local_98.Yaw = 0.0;
      local_98.gyrz = 0.0;
      local_98.Roll = 0.0;
      local_98.gyrx = 0.0;
      local_98.gyry = 0.0;
      local_98.accy = 0.0;
      local_98.accz = 0.0;
      local_98.roll = 0.0;
      local_98.accx = 0.0;
      local_98.yaw = 0.0;
      local_98.pitch = 0.0;
      iVar6 = 0;
      do {
        local_a8.tv_sec = (long)*(int *)((long)pParam + 0x588) / 1000;
        local_a8.tv_nsec = ((long)*(int *)((long)pParam + 0x588) % 1000) * 1000000;
        nanosleep(&local_a8,(timespec *)0x0);
        iVar1 = GetLatestDataRazorAHRS((RAZORAHRS *)pParam,&local_98);
        if (iVar1 != 0) {
          iVar6 = iVar1;
        }
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        pRVar4 = &local_98;
        pRVar5 = pRVar7;
        for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
          pRVar5->yaw = pRVar4->yaw;
          pRVar4 = (RAZORAHRSDATA *)((long)pRVar4 + (ulong)bVar8 * -0x10 + 8);
          pRVar5 = (RAZORAHRSDATA *)((long)pRVar5 + ((ulong)bVar8 * -2 + 1) * 8);
        }
        *(int *)((long)resRazorAHRS + lVar3) = iVar6;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      } while (*(int *)((long)bExitRazorAHRS + lVar3) == 0);
      return (void *)0x0;
    }
    __mutex = __mutex + 1;
    pRVar7 = pRVar7 + 1;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x40);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE RazorAHRSThread(void* pParam)
{
	RAZORAHRS* pRazorAHRS = (RAZORAHRS*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	RAZORAHRSDATA razorahrsdata;

	while (addrsRazorAHRS[id] != pRazorAHRS)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

	memset(&razorahrsdata, 0, sizeof(RAZORAHRSDATA));
	for (;;)
	{
		mSleep(pRazorAHRS->threadperiod);
		//memset(&razorahrsdata, 0, sizeof(RAZORAHRSDATA));
		res = GetLatestDataRazorAHRS(pRazorAHRS, &razorahrsdata);
		if (res != EXIT_SUCCESS) err = res;
		//if (GetLatestDataRazorAHRS(pRazorAHRS, &razorahrsdata) == EXIT_SUCCESS)
		{
			EnterCriticalSection(&RazorAHRSCS[id]);
			razorahrsdataRazorAHRS[id] = razorahrsdata;
			resRazorAHRS[id] = err;
			LeaveCriticalSection(&RazorAHRSCS[id]);
		}
		if (bExitRazorAHRS[id]) break;
	}

	return 0;
}